

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclCon.h
# Opt level: O0

void Scl_ConWrite(Scl_Con_t *p,char *pFileName)

{
  int iVar1;
  void *pvVar2;
  word wVar3;
  char *pcVar4;
  float fVar5;
  FILE *local_40;
  FILE *pFile;
  int i;
  word Value;
  char *pName;
  char *pFileName_local;
  Scl_Con_t *p_local;
  
  if (pFileName == (char *)0x0) {
    local_40 = _stdout;
  }
  else {
    local_40 = fopen(pFileName,"wb");
  }
  if (local_40 == (FILE *)0x0) {
    printf("Cannot open output file \"%s\".\n",pFileName);
  }
  else {
    fprintf(local_40,".model %s\n",p->pModelName);
    if (p->pInCellDef != (char *)0x0) {
      fprintf(local_40,".default_%s %s\n","input_cell",p->pInCellDef);
    }
    if (p->tInArrDef != 0) {
      fVar5 = Scl_Wrd2Flt(p->tInArrDef);
      fprintf(local_40,".default_%s %.2f\n",(double)fVar5,"input_arrival");
    }
    if (p->tInSlewDef != 0) {
      fVar5 = Scl_Wrd2Flt(p->tInSlewDef);
      fprintf(local_40,".default_%s %.2f\n",(double)fVar5,"input_slew");
    }
    if (p->tInLoadDef != 0) {
      fVar5 = Scl_Wrd2Flt(p->tInLoadDef);
      fprintf(local_40,".default_%s %.2f\n",(double)fVar5,"input_load");
    }
    if (p->tOutReqDef != 0) {
      fVar5 = Scl_Wrd2Flt(p->tOutReqDef);
      fprintf(local_40,".default_%s %.2f\n",(double)fVar5,"output_required");
    }
    if (p->tOutLoadDef != 0) {
      fVar5 = Scl_Wrd2Flt(p->tOutLoadDef);
      fprintf(local_40,".default_%s %.2f\n",(double)fVar5,"output_load");
    }
    for (pFile._4_4_ = 0; iVar1 = Vec_PtrSize(&p->vInCells), pFile._4_4_ < iVar1;
        pFile._4_4_ = pFile._4_4_ + 1) {
      pvVar2 = Vec_PtrEntry(&p->vInCells,pFile._4_4_);
      if (pvVar2 != (void *)0x0) {
        pcVar4 = Abc_NamStr(p->pNamI,pFile._4_4_ + 1);
        fprintf(local_40,".%s %s %s\n","input_cell",pcVar4,pvVar2);
      }
    }
    for (pFile._4_4_ = 0; iVar1 = Vec_WrdSize(&p->vInArrs), pFile._4_4_ < iVar1;
        pFile._4_4_ = pFile._4_4_ + 1) {
      wVar3 = Vec_WrdEntry(&p->vInArrs,pFile._4_4_);
      if (wVar3 != p->tInArrDef) {
        pcVar4 = Abc_NamStr(p->pNamI,pFile._4_4_ + 1);
        fVar5 = Scl_Wrd2Flt(wVar3);
        fprintf(local_40,".%s %s %.2f\n",(double)fVar5,"input_arrival",pcVar4);
      }
    }
    for (pFile._4_4_ = 0; iVar1 = Vec_WrdSize(&p->vInSlews), pFile._4_4_ < iVar1;
        pFile._4_4_ = pFile._4_4_ + 1) {
      wVar3 = Vec_WrdEntry(&p->vInSlews,pFile._4_4_);
      if (wVar3 != p->tInSlewDef) {
        pcVar4 = Abc_NamStr(p->pNamI,pFile._4_4_ + 1);
        fVar5 = Scl_Wrd2Flt(wVar3);
        fprintf(local_40,".%s %s %.2f\n",(double)fVar5,"input_slew",pcVar4);
      }
    }
    for (pFile._4_4_ = 0; iVar1 = Vec_WrdSize(&p->vInLoads), pFile._4_4_ < iVar1;
        pFile._4_4_ = pFile._4_4_ + 1) {
      wVar3 = Vec_WrdEntry(&p->vInLoads,pFile._4_4_);
      if (wVar3 != p->tInLoadDef) {
        pcVar4 = Abc_NamStr(p->pNamI,pFile._4_4_ + 1);
        fVar5 = Scl_Wrd2Flt(wVar3);
        fprintf(local_40,".%s %s %.2f\n",(double)fVar5,"input_load",pcVar4);
      }
    }
    for (pFile._4_4_ = 0; iVar1 = Vec_WrdSize(&p->vOutReqs), pFile._4_4_ < iVar1;
        pFile._4_4_ = pFile._4_4_ + 1) {
      wVar3 = Vec_WrdEntry(&p->vOutReqs,pFile._4_4_);
      if (wVar3 != p->tOutReqDef) {
        pcVar4 = Abc_NamStr(p->pNamO,pFile._4_4_ + 1);
        fVar5 = Scl_Wrd2Flt(wVar3);
        fprintf(local_40,".%s %s %.2f\n",(double)fVar5,"output_required",pcVar4);
      }
    }
    for (pFile._4_4_ = 0; iVar1 = Vec_WrdSize(&p->vOutLoads), pFile._4_4_ < iVar1;
        pFile._4_4_ = pFile._4_4_ + 1) {
      wVar3 = Vec_WrdEntry(&p->vOutLoads,pFile._4_4_);
      if (wVar3 != p->tOutLoadDef) {
        pcVar4 = Abc_NamStr(p->pNamO,pFile._4_4_ + 1);
        fVar5 = Scl_Wrd2Flt(wVar3);
        fprintf(local_40,".%s %s %.2f\n",(double)fVar5,"output_load",pcVar4);
      }
    }
    if (local_40 != _stdout) {
      fclose(local_40);
    }
  }
  return;
}

Assistant:

static inline void Scl_ConWrite( Scl_Con_t * p, char * pFileName )
{
    char * pName; word Value; int i;
    FILE * pFile = pFileName ? fopen( pFileName, "wb" ) : stdout;
    if ( pFile == NULL )
    {
        printf( "Cannot open output file \"%s\".\n", pFileName );
        return;
    }
    fprintf( pFile, ".model %s\n", p->pModelName );

    if ( p->pInCellDef )        fprintf( pFile, ".default_%s %s\n",   SCL_INPUT_CELL,  p->pInCellDef );
    if ( p->tInArrDef   != 0 )  fprintf( pFile, ".default_%s %.2f\n", SCL_INPUT_ARR,   Scl_Wrd2Flt(p->tInArrDef) );
    if ( p->tInSlewDef  != 0 )  fprintf( pFile, ".default_%s %.2f\n", SCL_INPUT_SLEW,  Scl_Wrd2Flt(p->tInSlewDef) );
    if ( p->tInLoadDef  != 0 )  fprintf( pFile, ".default_%s %.2f\n", SCL_INPUT_LOAD,  Scl_Wrd2Flt(p->tInLoadDef) );
    if ( p->tOutReqDef  != 0 )  fprintf( pFile, ".default_%s %.2f\n", SCL_OUTPUT_REQ,  Scl_Wrd2Flt(p->tOutReqDef) );
    if ( p->tOutLoadDef != 0 )  fprintf( pFile, ".default_%s %.2f\n", SCL_OUTPUT_LOAD, Scl_Wrd2Flt(p->tOutLoadDef) );

    Vec_PtrForEachEntry(char *, &p->vInCells, pName, i) if ( pName )                   fprintf( pFile, ".%s %s %s\n",   SCL_INPUT_CELL,  Abc_NamStr(p->pNamI, i+1), pName );
    Vec_WrdForEachEntry( &p->vInArrs, Value, i )        if ( Value != p->tInArrDef )   fprintf( pFile, ".%s %s %.2f\n", SCL_INPUT_ARR,   Abc_NamStr(p->pNamI, i+1), Scl_Wrd2Flt(Value) );
    Vec_WrdForEachEntry( &p->vInSlews, Value, i )       if ( Value != p->tInSlewDef )  fprintf( pFile, ".%s %s %.2f\n", SCL_INPUT_SLEW,  Abc_NamStr(p->pNamI, i+1), Scl_Wrd2Flt(Value) );
    Vec_WrdForEachEntry( &p->vInLoads, Value, i )       if ( Value != p->tInLoadDef )  fprintf( pFile, ".%s %s %.2f\n", SCL_INPUT_LOAD,  Abc_NamStr(p->pNamI, i+1), Scl_Wrd2Flt(Value) );
    Vec_WrdForEachEntry( &p->vOutReqs, Value, i )       if ( Value != p->tOutReqDef )  fprintf( pFile, ".%s %s %.2f\n", SCL_OUTPUT_REQ,  Abc_NamStr(p->pNamO, i+1), Scl_Wrd2Flt(Value) );
    Vec_WrdForEachEntry( &p->vOutLoads, Value, i )      if ( Value != p->tOutLoadDef ) fprintf( pFile, ".%s %s %.2f\n", SCL_OUTPUT_LOAD, Abc_NamStr(p->pNamO, i+1), Scl_Wrd2Flt(Value) );

    if ( pFile != stdout )
        fclose ( pFile );
}